

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration * __thiscall absl::lts_20250127::Duration::operator*=(Duration *this,double r)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 in_RDX;
  long lVar4;
  double dVar5;
  Duration d;
  Duration DVar6;
  Duration local_40;
  double lo_int;
  double hi_int;
  
  uVar1 = this->rep_lo_;
  if ((ulong)ABS(r) < 0x7ff0000000000000 && uVar1 != 0xffffffff) {
    hi_int = 0.0;
    dVar5 = modf((double)(long)this->rep_hi_ * r,&hi_int);
    lo_int = 0.0;
    dVar5 = modf(dVar5 + ((double)uVar1 * r) / 4000000000.0,&lo_int);
    dVar5 = round(dVar5 * 4000000000.0);
    local_40.rep_hi_.lo_ = 0;
    local_40.rep_hi_.hi_ = 0;
    local_40.rep_lo_ = 0;
    bVar2 = anon_unknown_1::SafeAddRepHi(hi_int,lo_int,&local_40);
    if (bVar2) {
      lVar4 = (long)dVar5 % 4000000000;
      bVar2 = anon_unknown_1::SafeAddRepHi
                        ((double)(long)local_40.rep_hi_,(double)((long)dVar5 / 4000000000),&local_40
                        );
      if (bVar2) {
        uVar3 = (uint32_t)lVar4 + 4000000000;
        if (-1 < lVar4) {
          uVar3 = (uint32_t)lVar4;
        }
        DVar6.rep_lo_ = uVar3;
        DVar6.rep_hi_ = (HiRep)((long)local_40.rep_hi_ + (lVar4 >> 0x3f));
        goto LAB_00200398;
      }
    }
    DVar6.rep_lo_ = local_40.rep_lo_;
    DVar6.rep_hi_ = local_40.rep_hi_;
  }
  else if ((long)((ulong)r ^ (ulong)this->rep_hi_) < 0) {
    d.rep_lo_ = (uint32_t)CONCAT71((int7)((ulong)in_RDX >> 8),uVar1 != 0xffffffff);
    d.rep_hi_.lo_ = 0xffffffff;
    d.rep_hi_.hi_ = 0xffffffff;
    DVar6 = operator-((lts_20250127 *)0x7fffffffffffffff,d);
  }
  else {
    DVar6.rep_lo_ = 0xffffffff;
    DVar6.rep_hi_.lo_ = 0xffffffff;
    DVar6.rep_hi_.hi_ = 0x7fffffff;
  }
LAB_00200398:
  *this = DVar6;
  return this;
}

Assistant:

Duration& Duration::operator*=(double r) {
  if (time_internal::IsInfiniteDuration(*this) || !IsFinite(r)) {
    const bool is_neg = std::signbit(r) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleDouble<std::multiplies>(*this, r);
}